

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<QObject_const*,QHash<int,bool>>::tryEmplace_impl<QObject_const*const&>
          (TryEmplaceResult *__return_storage_ptr__,QHash<QObject_const*,QHash<int,bool>> *this,
          QObject **key)

{
  uchar uVar1;
  Span *pSVar2;
  Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> *pDVar3;
  ulong uVar4;
  Node<const_QObject_*,_QHash<int,_bool>_> *pNVar6;
  long in_FS_OFFSET;
  Bucket BVar8;
  QHash<const_QObject_*,_QHash<int,_bool>_> local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = *(Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> **)this;
  if (pDVar3 == (Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> *)0x0) {
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_>::detached
                       ((Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> *)0x0);
    *(Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> **)this = pDVar3;
  }
  local_40.d = (Data *)0x0;
  uVar4 = pDVar3->seed ^ (ulong)*key;
  uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
  uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
  uVar4 = uVar4 >> 0x20 ^ uVar4;
  BVar8 = QHashPrivate::Data<QHashPrivate::Node<QObject_const*,QHash<int,bool>>>::
          findBucketWithHash<QObject_const*>
                    ((Data<QHashPrivate::Node<QObject_const*,QHash<int,bool>>> *)pDVar3,key,uVar4);
  uVar7 = BVar8.index;
  pSVar5 = BVar8.span;
  uVar1 = pSVar5->offsets[uVar7];
  pDVar3 = *(Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> **)this;
  if ((pDVar3 == (Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> *)0x0) ||
     (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    QHash<const_QObject_*,_QHash<int,_bool>_>::operator=
              (&local_40,(QHash<const_QObject_*,_QHash<int,_bool>_> *)this);
    if (uVar1 == 0xff) {
LAB_0037ab89:
      pDVar3 = *(Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> **)this;
      if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
        pDVar3 = QHashPrivate::Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_>::
                 detached(pDVar3,pDVar3->size + 1);
        *(Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> **)this = pDVar3;
        BVar8 = QHashPrivate::Data<QHashPrivate::Node<QObject_const*,QHash<int,bool>>>::
                findBucketWithHash<QObject_const*>
                          ((Data<QHashPrivate::Node<QObject_const*,QHash<int,bool>>> *)pDVar3,key,
                           uVar4);
        goto LAB_0037ac06;
      }
    }
    else {
      pDVar3 = *(Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> **)this;
    }
    pSVar2 = pDVar3->spans;
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_>::detached
                       (pDVar3);
    *(Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> **)this = pDVar3;
    BVar8.index._0_4_ = (uint)BVar8.index & 0x7f;
    BVar8.span = pDVar3->spans +
                 ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7);
    BVar8.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_0037ac2a;
  }
  else {
    if (uVar1 != 0xff) goto LAB_0037ac2a;
    if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
      QHash<const_QObject_*,_QHash<int,_bool>_>::operator=
                (&local_40,(QHash<const_QObject_*,_QHash<int,_bool>_> *)this);
      goto LAB_0037ab89;
    }
  }
LAB_0037ac06:
  pNVar6 = QHashPrivate::Span<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_>::insert
                     (BVar8.span,BVar8.index);
  pNVar6->key = *key;
  (pNVar6->value).d = (Data *)0x0;
  pDVar3 = *(Data<QHashPrivate::Node<const_QObject_*,_QHash<int,_bool>_>_> **)this;
  pDVar3->size = pDVar3->size + 1;
LAB_0037ac2a:
  pSVar5 = pDVar3->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar3;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar8.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar8.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<const_QObject_*,_QHash<int,_bool>_>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }